

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O3

string * join<int>(string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *values,
                  string *delim)

{
  pointer piVar1;
  string *psVar2;
  ulong uVar3;
  ulong uVar4;
  ostringstream str;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    uVar4 = 0;
    do {
      std::ostream::operator<<((ostream *)local_1a0,piVar1[uVar4]);
      piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
      if (uVar4 < uVar3 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,(delim->_M_dataplus)._M_p,delim->_M_string_length);
        piVar1 = (values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = (long)(values->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  psVar2 = (string *)std::ios_base::~ios_base(local_130);
  return psVar2;
}

Assistant:

static std::string join(const std::vector<T> & values, const std::string & delim) {
    std::ostringstream str;
    for (size_t i = 0; i < values.size(); i++) {
        str << values[i];
        if (i < values.size() - 1) {
            str << delim;
        }
    }
    return str.str();
}